

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_load.cpp
# Opt level: O2

ParsedExtensionMetaData *
duckdb::ExtensionHelper::ParseExtensionMetaData
          (ParsedExtensionMetaData *__return_storage_ptr__,char *metadata)

{
  reference pvVar1;
  long lVar2;
  string *this;
  string *s;
  char *pcVar3;
  bool bVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  metadata_field;
  string extension_abi_metadata;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  ParsedExtensionMetaData::ParsedExtensionMetaData(__return_storage_ptr__);
  metadata_field.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  metadata_field.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  metadata_field.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar2 = 8;
  pcVar3 = metadata;
  while (bVar4 = lVar2 != 0, lVar2 = lVar2 + -1, bVar4) {
    extension_abi_metadata._M_dataplus._M_p = (pointer)&extension_abi_metadata.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&extension_abi_metadata,pcVar3,pcVar3 + 0x20);
    ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&metadata_field,
               &extension_abi_metadata);
    ::std::__cxx11::string::~string((string *)&extension_abi_metadata);
    pcVar3 = pcVar3 + 0x20;
  }
  ::std::
  __reverse<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (metadata_field.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pvVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::get<true>(&metadata_field,0);
  ::std::__cxx11::string::string((string *)&local_50,(string *)pvVar1);
  FilterZeroAtEnd(&extension_abi_metadata,&local_50);
  ::std::__cxx11::string::operator=
            ((string *)__return_storage_ptr__,(string *)&extension_abi_metadata);
  ::std::__cxx11::string::~string((string *)&extension_abi_metadata);
  ::std::__cxx11::string::~string((string *)&local_50);
  bVar4 = ParsedExtensionMetaData::AppearsValid(__return_storage_ptr__);
  if (!bVar4) goto LAB_019828f9;
  pvVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::get<true>(&metadata_field,1);
  ::std::__cxx11::string::string((string *)&local_70,(string *)pvVar1);
  FilterZeroAtEnd(&extension_abi_metadata,&local_70);
  ::std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->platform,(string *)&extension_abi_metadata);
  ::std::__cxx11::string::~string((string *)&extension_abi_metadata);
  ::std::__cxx11::string::~string((string *)&local_70);
  pvVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::get<true>(&metadata_field,3);
  ::std::__cxx11::string::string((string *)&local_90,(string *)pvVar1);
  FilterZeroAtEnd(&extension_abi_metadata,&local_90);
  ::std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->extension_version,(string *)&extension_abi_metadata)
  ;
  ::std::__cxx11::string::~string((string *)&extension_abi_metadata);
  ::std::__cxx11::string::~string((string *)&local_90);
  pvVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
           ::get<true>(&metadata_field,4);
  ::std::__cxx11::string::string((string *)&local_b0,(string *)pvVar1);
  FilterZeroAtEnd(&extension_abi_metadata,&local_b0);
  ::std::__cxx11::string::~string((string *)&local_b0);
  bVar4 = ::std::operator==(&extension_abi_metadata,"C_STRUCT");
  if (bVar4) {
    __return_storage_ptr__->abi_type = C_STRUCT;
    pvVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
             ::get<true>(&metadata_field,2);
    ::std::__cxx11::string::string((string *)&local_d0,(string *)pvVar1);
    s = &local_d0;
    FilterZeroAtEnd(&local_130,s);
    this = (string *)&__return_storage_ptr__->duckdb_capi_version;
LAB_01982899:
    ::std::__cxx11::string::operator=(this,(string *)&local_130);
    ::std::__cxx11::string::~string((string *)&local_130);
    ::std::__cxx11::string::~string((string *)s);
  }
  else {
    bVar4 = ::std::operator==(&extension_abi_metadata,"C_STRUCT_UNSTABLE");
    if (bVar4) {
      __return_storage_ptr__->abi_type = C_STRUCT_UNSTABLE;
      pvVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&metadata_field,2);
      ::std::__cxx11::string::string((string *)&local_f0,(string *)pvVar1);
      s = &local_f0;
LAB_0198288a:
      FilterZeroAtEnd(&local_130,s);
      this = (string *)&__return_storage_ptr__->duckdb_version;
      goto LAB_01982899;
    }
    bVar4 = ::std::operator==(&extension_abi_metadata,"CPP");
    if ((bVar4) || (extension_abi_metadata._M_string_length == 0)) {
      __return_storage_ptr__->abi_type = CPP;
      pvVar1 = vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
               ::get<true>(&metadata_field,2);
      ::std::__cxx11::string::string((string *)&local_110,(string *)pvVar1);
      s = &local_110;
      goto LAB_0198288a;
    }
    __return_storage_ptr__->abi_type = UNKNOWN;
    ::std::__cxx11::string::assign((char *)&__return_storage_ptr__->duckdb_version);
    ::std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->extension_abi_metadata);
  }
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,metadata,metadata + 0x100);
  ::std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->signature,(string *)&local_130);
  ::std::__cxx11::string::~string((string *)&local_130);
  ::std::__cxx11::string::~string((string *)&extension_abi_metadata);
LAB_019828f9:
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&metadata_field);
  return __return_storage_ptr__;
}

Assistant:

ParsedExtensionMetaData ExtensionHelper::ParseExtensionMetaData(const char *metadata) noexcept {
	ParsedExtensionMetaData result;

	vector<string> metadata_field;
	for (idx_t i = 0; i < 8; i++) {
		string field = string(metadata + i * 32, 32);
		metadata_field.emplace_back(field);
	}

	std::reverse(metadata_field.begin(), metadata_field.end());

	// Fetch the magic value and early out if this is invalid: the rest will just be bogus
	result.magic_value = FilterZeroAtEnd(metadata_field[0]);
	if (!result.AppearsValid()) {
		return result;
	}

	result.platform = FilterZeroAtEnd(metadata_field[1]);

	result.extension_version = FilterZeroAtEnd(metadata_field[3]);

	auto extension_abi_metadata = FilterZeroAtEnd(metadata_field[4]);

	if (extension_abi_metadata == "C_STRUCT") {
		result.abi_type = ExtensionABIType::C_STRUCT;
		result.duckdb_capi_version = FilterZeroAtEnd(metadata_field[2]);
	} else if (extension_abi_metadata == "C_STRUCT_UNSTABLE") {
		result.abi_type = ExtensionABIType::C_STRUCT_UNSTABLE;
		result.duckdb_version = FilterZeroAtEnd(metadata_field[2]);
	} else if (extension_abi_metadata == "CPP" || extension_abi_metadata.empty()) {
		result.abi_type = ExtensionABIType::CPP;
		result.duckdb_version = FilterZeroAtEnd(metadata_field[2]);
	} else {
		result.abi_type = ExtensionABIType::UNKNOWN;
		result.duckdb_version = "unknown";
		result.extension_abi_metadata = extension_abi_metadata;
	}

	result.signature = string(metadata, ParsedExtensionMetaData::FOOTER_SIZE - ParsedExtensionMetaData::SIGNATURE_SIZE);
	return result;
}